

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__get_cgroup2_memory_limits(char *buf,uint64_t *high,uint64_t *max)

{
  char *__s;
  size_t sVar1;
  uint64_t uVar2;
  int n;
  char *p;
  char filename [4097];
  uint64_t *max_local;
  uint64_t *high_local;
  char *buf_local;
  
  __s = buf + 4;
  unique0x100000a5 = max;
  sVar1 = strcspn(__s,"\n");
  snprintf((char *)&p,0x1001,"/sys/fs/cgroup/%.*s/memory.max",sVar1 & 0xffffffff,__s);
  uVar2 = uv__read_uint64((char *)&p);
  *stack0xffffffffffffffe0 = uVar2;
  snprintf((char *)&p,0x1001,"/sys/fs/cgroup/%.*s/memory.high",sVar1 & 0xffffffff,__s);
  uVar2 = uv__read_uint64((char *)&p);
  *high = uVar2;
  return;
}

Assistant:

static void uv__get_cgroup2_memory_limits(char buf[static 1024], uint64_t* high,
                                          uint64_t* max) {
  char filename[4097];
  char* p;
  int n;

  /* Find out where the controller is mounted. */
  p = buf + strlen("0::/");
  n = (int) strcspn(p, "\n");

  /* Read the memory limits of the controller. */
  snprintf(filename, sizeof(filename), "/sys/fs/cgroup/%.*s/memory.max", n, p);
  *max = uv__read_uint64(filename);
  snprintf(filename, sizeof(filename), "/sys/fs/cgroup/%.*s/memory.high", n, p);
  *high = uv__read_uint64(filename);
}